

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::ProjectionLight::SampleLe
          (LightLeSample *__return_storage_ptr__,ProjectionLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined8 uVar1;
  Tuple2<pbrt::Point2,_float> TVar2;
  uintptr_t uVar3;
  bool bVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  Float *pFVar10;
  int c;
  int c_00;
  Tuple2<pbrt::Point2,_int> p;
  undefined1 in_ZmmResult [64];
  undefined1 auVar17 [48];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  float fVar18;
  float fVar19;
  Float FVar20;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float n2;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  SampledSpectrum SVar38;
  float local_118;
  Float pdf;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int vb;
  undefined1 auStack_a4 [12];
  Interval<float> local_98;
  Point3fi o;
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar27 [56];
  undefined1 auVar32 [56];
  
  auVar17 = in_ZmmResult._16_48_;
  auVar30._0_8_ = PiecewiseConstant2D::Sample(&this->distrib,u1,&pdf);
  auVar30._8_56_ = extraout_var;
  auVar34 = ZEXT816(0) << 0x40;
  auVar22 = auVar30._0_16_;
  if ((pdf != 0.0) || (NAN(pdf))) {
    auVar7 = vmovshdup_avx(auVar22);
    fVar28 = auVar7._0_4_;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[0][1])),auVar22,
                             ZEXT416((uint)(this->LightFromScreen).m.m[0][0]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar34,ZEXT416((uint)(this->LightFromScreen).m.m[0][2]));
    fVar19 = auVar7._0_4_ + (this->LightFromScreen).m.m[0][3];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[1][1])),auVar22,
                             ZEXT416((uint)(this->LightFromScreen).m.m[1][0]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar34,ZEXT416((uint)(this->LightFromScreen).m.m[1][2]));
    fVar18 = auVar7._0_4_ + (this->LightFromScreen).m.m[1][3];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[2][1])),auVar22,
                             ZEXT416((uint)(this->LightFromScreen).m.m[2][0]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar34,ZEXT416((uint)(this->LightFromScreen).m.m[2][2]));
    fVar5 = auVar7._0_4_ + (this->LightFromScreen).m.m[2][3];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (this->LightFromScreen).m.m[3][1])),auVar22,
                             ZEXT416((uint)(this->LightFromScreen).m.m[3][0]));
    auVar34 = vfmadd231ss_fma(auVar7,auVar34,ZEXT416((uint)(this->LightFromScreen).m.m[3][2]));
    fVar28 = auVar34._0_4_ + (this->LightFromScreen).m.m[3][3];
    bVar4 = fVar28 == 1.0;
    fVar35 = fVar19 / fVar28;
    fVar37 = fVar18 / fVar28;
    fVar28 = fVar5 / fVar28;
    auVar12._16_48_ = auVar17;
    auVar12._0_16_ = ZEXT416((uint)fVar35);
    auVar11._4_60_ = auVar12._4_60_;
    auVar11._0_4_ = (float)((uint)bVar4 * (int)fVar19 + (uint)!bVar4 * (int)fVar35);
    auVar14._16_48_ = auVar17;
    auVar14._0_16_ = ZEXT416((uint)fVar37);
    auVar13._4_60_ = auVar14._4_60_;
    auVar13._0_4_ = (float)((uint)bVar4 * (int)fVar18 + (uint)!bVar4 * (int)fVar37);
    auVar16._16_48_ = auVar17;
    auVar16._0_16_ = ZEXT416((uint)fVar28);
    auVar15._4_60_ = auVar16._4_60_;
    auVar15._0_4_ = (uint)bVar4 * (int)fVar5 + (uint)!bVar4 * (int)fVar28;
    local_e8 = auVar15._0_16_;
    p = (Tuple2<pbrt::Point2,_int>)&(this->super_LightBase).renderFromLight;
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar13._0_4_)),auVar11._0_16_,
                              auVar11._0_16_);
    auVar34 = vfmadd231ss_fma(auVar34,local_e8,local_e8);
    fVar19 = auVar34._0_4_;
    if (fVar19 < 0.0) {
      local_f8 = auVar13._0_16_;
      fVar18 = sqrtf(fVar19);
      auVar34 = local_f8;
    }
    else {
      auVar34 = vsqrtss_avx(auVar34,auVar34);
      fVar18 = auVar34._0_4_;
      auVar34 = auVar13._0_16_;
    }
    local_f8._0_4_ = auVar11._0_4_ / fVar18;
    local_d8._0_4_ = auVar34._0_4_ / fVar18;
    local_c8._0_4_ = (float)local_e8._0_4_ / fVar18;
    uVar3 = (this->super_LightBase).mediumInterface.outside.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    _vb = ZEXT416(0) << 0x20;
    local_98.low = 0.0;
    local_98.high = 0.0;
    Transform::operator()(&o,(Transform *)p,(Point3fi *)&vb);
    auVar34 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                            (this->super_LightBase).renderFromLight.m.m[0][1])),
                              ZEXT416((uint)local_f8._0_4_),
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
    auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)local_c8._0_4_),
                              ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                           (this->super_LightBase).renderFromLight.m.m[1][1])),
                             ZEXT416((uint)local_f8._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
    local_b8 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_c8._0_4_),
                               ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8._0_4_ *
                                           (this->super_LightBase).renderFromLight.m.m[2][1])),
                             ZEXT416((uint)local_f8._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
    local_f8 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_c8._0_4_),
                               ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
    fVar18 = local_b8._0_4_;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar18)),auVar34,auVar34);
    auVar7 = vfmadd231ss_fma(auVar7,local_f8,local_f8);
    if (0.0 < auVar7._0_4_) {
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar6 = vandps_avx(auVar34,auVar29);
      auVar21 = vandps_avx(local_b8,auVar29);
      auVar29 = vandps_avx(local_f8,auVar29);
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar6);
      auVar6 = vfmadd231ss_fma(auVar6,ZEXT816(0) << 0x40,auVar29);
      fVar28 = auVar6._0_4_ / auVar7._0_4_;
      fVar5 = auVar34._0_4_ * fVar28;
      local_d8 = ZEXT416((uint)(fVar18 * fVar28));
      local_c8 = ZEXT416((uint)(local_f8._0_4_ * fVar28));
      i.high = fVar5;
      i.low = fVar5;
      auVar23._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&o,i);
      auVar23._8_56_ = extraout_var_00;
      uVar1 = vmovlps_avx(auVar23._0_16_);
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
      low = (float)uVar1;
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
      high = (float)((ulong)uVar1 >> 0x20);
      i_00.high = (float)local_d8._0_4_;
      i_00.low = (float)local_d8._0_4_;
      auVar24._0_8_ =
           Interval<float>::operator+<float>
                     (&o.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
      auVar24._8_56_ = extraout_var_01;
      uVar1 = vmovlps_avx(auVar24._0_16_);
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
      low = (float)uVar1;
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
      high = (float)((ulong)uVar1 >> 0x20);
      i_01.high = (float)local_c8._0_4_;
      i_01.low = (float)local_c8._0_4_;
      auVar25._0_8_ =
           Interval<float>::operator+<float>
                     (&o.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
      auVar25._8_56_ = extraout_var_02;
      o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
           (Interval<float>)vmovlps_avx(auVar25._0_16_);
    }
    auVar6._4_4_ = o.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar6._0_4_ = o.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar6._8_4_ = o.super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar6._12_4_ =
         o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
         .high;
    auVar7 = vinsertps_avx(auVar6,ZEXT416((uint)o.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .high),0x10);
    auVar21._0_4_ =
         o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x
         .high + auVar7._0_4_;
    auVar21._4_4_ =
         o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
         .low + auVar7._4_4_;
    auVar21._8_4_ = auVar7._8_4_ + 0.0;
    auVar21._12_4_ = auVar7._12_4_ + 0.0;
    auVar7._8_4_ = 0x3f000000;
    auVar7._0_8_ = 0x3f0000003f000000;
    auVar7._12_4_ = 0x3f000000;
    local_c8 = vmulps_avx512vl(auVar21,auVar7);
    fVar18 = o.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low +
             o.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      auVar7 = vsqrtss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
      fVar19 = auVar7._0_4_;
    }
    auVar7 = _vb;
    o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low
         = (float)local_e8._0_4_ / fVar19;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_a4;
    _vb = auVar9 << 0x20;
    if (o.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.
        low <= 0.0) {
      LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x173,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [9])0x5db134,
                 (char (*) [2])0x5e8297,(char (*) [9])0x5db134,(float *)&o,(char (*) [2])0x5e8297,
                 &vb);
    }
    fVar19 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.x;
    fVar5 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y;
    TVar2 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar36._8_8_ = 0;
    auVar36._0_4_ = TVar2.x;
    auVar36._4_4_ = TVar2.y;
    fVar28 = fVar19 - TVar2.x;
    auVar6 = vmovshdup_avx(auVar36);
    local_e8 = vsubps_avx(auVar22,auVar36);
    if (TVar2.x < fVar19) {
      auVar8 = local_e8._4_12_;
      local_e8._0_4_ = local_e8._0_4_ / fVar28;
      local_e8._4_12_ = auVar8;
    }
    fVar19 = fVar5 - auVar6._0_4_;
    if (auVar6._0_4_ < fVar5) {
      auVar22 = vmovshdup_avx(local_e8);
      auVar33._0_4_ = auVar22._0_4_ / fVar19;
      auVar33._4_12_ = auVar22._4_12_;
      local_e8 = vinsertps_avx(local_e8,auVar33,0x10);
    }
    local_b8 = vinsertps_avx(auVar34,local_b8,0x10);
    local_d8._0_4_ = pdf;
    fVar5 = o.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low *
            o.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low *
            o.super_Point3<pbrt::Interval<float>_>.
            super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low * this->A;
    auVar30 = ZEXT464((uint)fVar5);
    auVar22 = vmovshdup_avx(local_e8);
    auStack_a4._8_4_ = auVar7._12_4_;
    _vb = (RGB)ZEXT812(0);
    c_00 = 0;
    do {
      local_118 = auVar22._0_4_;
      p = (Tuple2<pbrt::Point2,_int>)
          (CONCAT44(p.y,(int)(local_e8._0_4_ *
                             (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x)) |
          (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y *
                            local_118) << 0x20);
      FVar20 = Image::GetChannel(&this->image,(Point2i)p,c_00,(WrapMode2D)0x200000002);
      auVar32 = auVar30._8_56_;
      pFVar10 = (Float *)&vb;
      if ((c_00 != 0) && (pFVar10 = (Float *)auStack_a4, c_00 != 1)) {
        pFVar10 = (Float *)(auStack_a4 + 4);
      }
      *pFVar10 = FVar20;
      c_00 = c_00 + 1;
    } while (c_00 != 3);
    local_e8._0_4_ = (fVar28 * fVar19 * (float)local_d8._0_4_) / fVar5;
    fVar19 = this->scale;
    auVar22._4_4_ = fVar19;
    auVar22._0_4_ = fVar19;
    auVar22._8_4_ = fVar19;
    auVar22._12_4_ = fVar19;
    auVar27 = ZEXT856(auVar22._8_8_);
    RGBSpectrum::RGBSpectrum((RGBSpectrum *)&o,this->imageColorSpace,(RGB *)&vb);
    SVar38 = RGBSpectrum::Sample((RGBSpectrum *)&o,lambda);
    auVar31._0_8_ = SVar38.values.values._8_8_;
    auVar31._8_56_ = auVar32;
    auVar26._0_8_ = SVar38.values.values._0_8_;
    auVar26._8_56_ = auVar27;
    auVar22 = vmovlhps_avx(auVar26._0_16_,auVar31._0_16_);
    (__return_storage_ptr__->L).values.values[0] = auVar22._0_4_ * fVar19;
    (__return_storage_ptr__->L).values.values[1] = auVar22._4_4_ * fVar19;
    (__return_storage_ptr__->L).values.values[2] = auVar22._8_4_ * fVar19;
    (__return_storage_ptr__->L).values.values[3] = auVar22._12_4_ * fVar19;
    uVar1 = vmovlps_avx(local_c8);
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = fVar18 * 0.5;
    uVar1 = vmovlps_avx(local_b8);
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar1 >> 0x20);
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_f8._0_4_;
    (__return_storage_ptr__->ray).time = time;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = uVar3;
    (__return_storage_ptr__->intr).set = false;
    __return_storage_ptr__->pdfPos = 1.0;
    __return_storage_ptr__->pdfDir = (Float)local_e8._0_4_;
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x48) = 0;
    *(undefined8 *)&(__return_storage_ptr__->intr).set = 0;
    __return_storage_ptr__->pdfPos = 0.0;
    __return_storage_ptr__->pdfDir = 0.0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->intr).optionalValue + 0x40) = 0;
    (__return_storage_ptr__->L).values.values[0] = 0.0;
    (__return_storage_ptr__->L).values.values[1] = 0.0;
    (__return_storage_ptr__->L).values.values[2] = 0.0;
    (__return_storage_ptr__->L).values.values[3] = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
    (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = 0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    *(undefined8 *)&(__return_storage_ptr__->ray).time = 0;
    (__return_storage_ptr__->ray).medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = 0;
    (__return_storage_ptr__->intr).optionalValue.__align = (anon_struct_8_0_00000001_for___align)0x0
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

LightLeSample ProjectionLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                        SampledWavelengths &lambda, Float time) const {
    Float pdf;
    Point2f ps = distrib.Sample(u1, &pdf);
    if (pdf == 0)
        return {};

    Vector3f w = Vector3f(LightFromScreen(Point3f(ps.x, ps.y, 0)));

    Ray ray = renderFromLight(
        Ray(Point3f(0, 0, 0), Normalize(w), time, mediumInterface.outside));
    Float cosTheta = CosTheta(Normalize(w));
    CHECK_GT(cosTheta, 0);
    Float pdfDir = pdf * screenBounds.Area() / (A * Pow<3>(cosTheta));

    Point2f p = Point2f(screenBounds.Offset(ps));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(p, c);

    SampledSpectrum L = scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);

    return LightLeSample(L, ray, 1, pdfDir);
}